

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subscription.cpp
# Opt level: O2

void __thiscall
aeron::Subscription::Subscription
          (Subscription *this,ClientConductor *conductor,int64_t registrationId,string *channel,
          int32_t streamId,int32_t channelStatusId)

{
  __pointer_type pIVar1;
  undefined8 *puVar2;
  
  this->_vptr_Subscription = (_func_int **)&PTR__Subscription_00170ce0;
  this->m_conductor = conductor;
  std::__cxx11::string::string((string *)&this->m_channel,(string *)channel);
  this->m_channelStatusId = channelStatusId;
  this->m_roundRobinIndex = 0;
  this->m_registrationId = registrationId;
  this->m_streamId = streamId;
  pIVar1 = (__pointer_type)operator_new(0x10);
  puVar2 = (undefined8 *)operator_new__(8);
  *puVar2 = 0;
  pIVar1->m_images = (Image *)(puVar2 + 1);
  pIVar1->m_length = 0;
  (this->m_imageList)._M_b._M_p = pIVar1;
  (this->m_isClosed)._M_base._M_i = false;
  return;
}

Assistant:

Subscription::Subscription(
    ClientConductor &conductor,
    std::int64_t registrationId,
    const std::string &channel,
    std::int32_t streamId,
    std::int32_t channelStatusId) :
    m_conductor(conductor),
    m_channel(channel),
    m_channelStatusId(channelStatusId),
    m_registrationId(registrationId),
    m_streamId(streamId),
    m_imageList(new struct ImageList(new Image[0], 0)),
    m_isClosed(false)
{
}